

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_node * fy_node_by_path_internal(fy_node *fyn,char *path,size_t pathlen,fy_node_walk_flags flags)

{
  bool bVar1;
  fy_node *pfVar2;
  long lVar3;
  ushort **ppuVar4;
  void *pvVar5;
  fy_node_pair *pfVar6;
  fy_node *fyn_00;
  char cVar7;
  uint uVar8;
  size_t sVar9;
  fy_node_walk_flags fVar10;
  size_t sVar11;
  char *pcVar12;
  int iVar13;
  char *pcVar14;
  fy_token *fyn_01;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar15;
  char *pcVar16;
  char *pcVar17;
  undefined8 unaff_R15;
  ulong uVar18;
  char *pcVar19;
  char acStack_78 [8];
  void *local_70;
  char *local_68;
  char *end_idx;
  char *local_58;
  int local_4c;
  fy_node *pfStack_48;
  int code_length;
  char *local_40;
  fy_node_walk_flags local_38;
  uint local_34;
  
  pcVar17 = acStack_78;
  pcVar16 = acStack_78;
  pcVar12 = acStack_78;
  if (path == (char *)0x0 || fyn == (fy_node *)0x0) {
    return (fy_node *)0x0;
  }
  if (pathlen == 0xffffffffffffffff) {
    pathlen = strlen(path);
  }
  fVar10 = flags & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON);
  pcVar14 = path + pathlen;
  if (pathlen == 0) {
    uVar18 = 0;
  }
  else {
    uVar18 = CONCAT71((int7)((ulong)unaff_R15 >> 8),pcVar14[-1] == '/');
  }
  if (fVar10 == FYNWF_PTR_JSON) {
    if (pathlen == 0) {
      return fyn;
    }
    if (*path != '/') {
      return (fy_node *)0x0;
    }
    path = path + 1;
  }
  else if (fVar10 != FYNWF_PTR_RELJSON) {
    if (pcVar14 <= path) goto LAB_0012184d;
    while (*path == '/') {
      path = path + 1;
      pathlen = pathlen - 1;
      if (pathlen == 0) {
        return fyn;
      }
    }
  }
  local_34 = (uint)uVar18;
  pfVar2 = fy_node_follow_aliases(fyn,flags,true);
  if (pfVar2 == (fy_node *)0x0) {
    fyn = (fy_node *)0x0;
  }
  else {
    switch(pfVar2->field_0x34 & 3) {
    case 0:
      fyn = (fy_node *)0x0;
      break;
    case 1:
      if ((fVar10 == FYNWF_PTR_JSON) || (fVar10 == FYNWF_PTR_RELJSON)) {
        if (*path == '-') {
          return (fy_node *)0x0;
        }
        pfStack_48 = pfVar2;
        lVar3 = strtol(path,&local_68,10);
        iVar13 = (int)lVar3;
        if (iVar13 < 0) {
          return (fy_node *)0x0;
        }
        if (iVar13 == 0 && local_68 == path) {
          return (fy_node *)0x0;
        }
        path = local_68;
        if (local_68 < pcVar14) {
          path = local_68 + (*local_68 == '/');
        }
      }
      else {
        if (path < pcVar14) {
          ppuVar4 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar4 + (long)*path * 2 + 1) & 0x20) == 0) break;
            path = path + 1;
          } while (path < pcVar14);
        }
        cVar7 = *path;
        if ((long)cVar7 == 0x5b) {
          path = path + 1;
          pfStack_48 = pfVar2;
          local_40 = pcVar14;
        }
        else {
          pfStack_48 = pfVar2;
          local_40 = pcVar14;
          ppuVar4 = __ctype_b_loc();
          if ((cVar7 != '-') && (((*ppuVar4)[cVar7] & 0x800) == 0)) {
            return (fy_node *)0x0;
          }
        }
        lVar3 = strtol(path,&local_68,10);
        iVar13 = (int)lVar3;
        if (iVar13 == 0 && local_68 == path) {
          return (fy_node *)0x0;
        }
        if (local_68 < local_40) {
          ppuVar4 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar4 + (long)*local_68 * 2 + 1) & 0x20) == 0) break;
            local_68 = local_68 + 1;
          } while (local_68 < local_40);
        }
        if (cVar7 == '[') {
          if (*local_68 != ']') {
            return (fy_node *)0x0;
          }
          local_68 = local_68 + 1;
        }
        path = local_68;
        pcVar14 = local_40;
        if (local_68 < local_40) {
          ppuVar4 = __ctype_b_loc();
          do {
            path = local_68;
            pcVar14 = local_40;
            if ((*(byte *)((long)*ppuVar4 + (long)*local_68 * 2 + 1) & 0x20) == 0) break;
            local_68 = local_68 + 1;
            path = local_68;
          } while (local_68 < local_40);
        }
      }
      pfVar2 = fy_node_sequence_get_by_index(pfStack_48,iVar13);
      if ((char)local_34 != '\0') {
        pfVar2 = fy_node_follow_aliases(pfVar2,flags,false);
      }
      fyn = fy_node_by_path_internal(pfVar2,path,(long)pcVar14 - (long)path,flags);
      break;
    case 2:
      pcVar19 = path;
      if ((fVar10 == FYNWF_PTR_JSON) || (fVar10 == FYNWF_PTR_RELJSON)) {
        if (path < pcVar14) {
          bVar1 = false;
          do {
            cVar7 = *pcVar19;
            if (cVar7 == '/') break;
            pcVar19 = pcVar19 + 1;
            bVar1 = (bool)(bVar1 | cVar7 == '~');
          } while (pcVar19 < pcVar14);
          sVar11 = (long)pcVar19 - (long)path;
          pcVar17 = acStack_78;
          local_40 = pcVar14;
          if (bVar1) {
            pcVar17 = acStack_78 + -(sVar11 + 0x10 & 0xfffffffffffffff0);
            pcVar12 = pcVar17;
            while (path < pcVar19) {
              pcVar16 = path + 1;
              if (*path == '~') {
                if (pcVar19 <= pcVar16) {
                  return (fy_node *)0x0;
                }
                cVar7 = '/';
                if (path[1] == '0') {
                  cVar7 = '~';
                }
                *pcVar12 = cVar7;
                pcVar16 = path + 2;
              }
              else {
                *pcVar12 = *path;
              }
              pcVar12 = pcVar12 + 1;
              path = pcVar16;
            }
            sVar11 = (long)pcVar12 - (long)pcVar17;
            path = pcVar17;
          }
        }
        else {
          sVar11 = 0;
          local_40 = pcVar14;
        }
        if ((flags >> 0x12 & 1) != 0) {
          builtin_strncpy(pcVar17 + -8,"9\x16\x12",4);
          pcVar17[-4] = '\0';
          pcVar17[-3] = '\0';
          pcVar17[-2] = '\0';
          pcVar17[-1] = '\0';
          pvVar5 = memchr(path,0x25,sVar11);
          if (pvVar5 != (void *)0x0) {
            pcVar17 = pcVar17 + -(sVar11 + 0x10 & 0xfffffffffffffff0);
            pcVar12 = pcVar17;
            local_58 = pcVar17;
            pfStack_48 = pfVar2;
            local_38 = flags;
            if (0 < (long)sVar11) {
              end_idx = path + sVar11;
              do {
                pcVar16 = end_idx;
                sVar9 = (long)end_idx - (long)path;
                pcVar17[-8] = -0x74;
                pcVar17[-7] = '\x16';
                pcVar17[-6] = '\x12';
                pcVar17[-5] = '\0';
                pcVar17[-4] = '\0';
                pcVar17[-3] = '\0';
                pcVar17[-2] = '\0';
                pcVar17[-1] = '\0';
                local_70 = memchr(path,0x25,sVar9);
                iVar13 = (int)local_70;
                if (local_70 == (void *)0x0) {
                  iVar13 = (int)pcVar16;
                }
                sVar9 = (size_t)(iVar13 - (int)path);
                pcVar17[-8] = -0x54;
                pcVar17[-7] = '\x16';
                pcVar17[-6] = '\x12';
                pcVar17[-5] = '\0';
                pcVar17[-4] = '\0';
                pcVar17[-3] = '\0';
                pcVar17[-2] = '\0';
                pcVar17[-1] = '\0';
                memcpy(pcVar12,path,sVar9);
                pcVar12 = pcVar12 + sVar9;
                if (local_70 == (void *)0x0) break;
                local_4c = 4;
                sVar11 = (long)end_idx - (long)(path + sVar9);
                pcVar17[-8] = -0x26;
                pcVar17[-7] = '\x16';
                pcVar17[-6] = '\x12';
                pcVar17[-5] = '\0';
                pcVar17[-4] = '\0';
                pcVar17[-3] = '\0';
                pcVar17[-2] = '\0';
                pcVar17[-1] = '\0';
                path = fy_uri_esc(path + sVar9,sVar11,(uint8_t *)&local_68,&local_4c);
                if (path == (char *)0x0) {
                  return (fy_node *)0x0;
                }
                sVar9 = (size_t)local_4c;
                pcVar17[-8] = -8;
                pcVar17[-7] = '\x16';
                pcVar17[-6] = '\x12';
                pcVar17[-5] = '\0';
                pcVar17[-4] = '\0';
                pcVar17[-3] = '\0';
                pcVar17[-2] = '\0';
                pcVar17[-1] = '\0';
                memcpy(pcVar12,&local_68,sVar9);
                pcVar12 = pcVar12 + sVar9;
              } while (path < end_idx);
            }
            sVar11 = (long)pcVar12 - (long)local_58;
            path = local_58;
            pfVar2 = pfStack_48;
            flags = local_38;
          }
        }
        builtin_strncpy(pcVar17 + -8,"T\x17\x12",4);
        pcVar17[-4] = '\0';
        pcVar17[-3] = '\0';
        pcVar17[-2] = '\0';
        pcVar17[-1] = '\0';
        pfVar6 = fy_node_mapping_lookup_pair_by_simple_key(pfVar2,path,sVar11);
        pcVar16 = pcVar17;
        if (pfVar6 == (fy_node_pair *)0x0) {
LAB_00121807:
          fyn_00 = (fy_node *)0x0;
          pcVar12 = pcVar16;
          uVar8 = local_34;
        }
        else {
          fyn_00 = pfVar6->value;
          pcVar12 = pcVar17;
          uVar8 = local_34;
        }
      }
      else {
        pcVar12 = path;
        local_40 = pcVar14;
        fVar10 = flags;
        if (path < pcVar14) {
          do {
            local_38 = fVar10;
            pfStack_48 = pfVar2;
            cVar7 = *pcVar12;
            pfVar2 = pfStack_48;
            pcVar19 = pcVar12;
            flags = local_38;
            if (cVar7 == '/') break;
            pcVar19 = pcVar12 + 1;
            if (cVar7 == '\"') {
              while( true ) {
                pcVar12 = pcVar19;
                if (pcVar14 <= pcVar12) {
                  return (fy_node *)0x0;
                }
                pcVar19 = pcVar12 + 1;
                if (*pcVar12 == '\"') break;
                if ((pcVar19 < pcVar14 && *pcVar12 == '\\') && (pcVar12[1] == '\"')) {
                  pcVar19 = pcVar12 + 2;
                }
              }
            }
            else if (cVar7 == '\\') {
              if (pcVar14 <= pcVar19) {
                return (fy_node *)0x0;
              }
              pvVar5 = memchr("/*&.{}[]\\",(int)*pcVar19,10);
              if (pvVar5 == (void *)0x0) {
                return (fy_node *)0x0;
              }
              pcVar19 = pcVar12 + 2;
              pcVar14 = local_40;
            }
            else if (cVar7 == '\'') {
              while( true ) {
                if (pcVar14 <= pcVar19) {
                  return (fy_node *)0x0;
                }
                if (*pcVar19 == '\'') break;
                pcVar19 = pcVar19 + 1;
              }
              pcVar19 = pcVar19 + 1;
            }
            pfVar2 = pfStack_48;
            pcVar12 = pcVar19;
            flags = local_38;
            fVar10 = local_38;
          } while (pcVar19 < pcVar14);
        }
        sVar11 = (long)pcVar19 - (long)path;
        fyn_00 = fy_node_mapping_lookup_by_string(pfVar2,path,sVar11);
        pcVar12 = acStack_78;
        uVar8 = local_34;
        if (fyn_00 == (fy_node *)0x0) {
          if ((flags & (FYNWF_PTR_RELJSON|FYNWF_PTR_JSON|FYNWF_FOLLOW)) != FYNWF_FOLLOW)
          goto LAB_00121807;
          fyn_00 = fy_node_mapping_lookup_by_string(pfVar2,"<<",2);
          uVar8 = local_34;
          if (fyn_00 == (fy_node *)0x0) {
            fyn = (fy_node *)0x0;
            pcVar14 = local_40;
            path = pcVar19;
            break;
          }
          if ((fyn_00->field_0x34 & 3) == 1) {
            paVar15 = &fyn_00->field_12;
            fyn_01 = (fyn_00->field_12).scalar;
            pcVar12 = acStack_78;
            local_38 = flags;
            if (fyn_01 != (fy_token *)0x0 && fyn_01 != (fy_token *)paVar15) {
              do {
                if ((((ulong)fyn_01->text0 & 0x300000000) == 0) && (fyn_01->analyze_flags == 7)) {
                  pfVar2 = fy_node_follow_aliases((fy_node *)fyn_01,local_38,false);
                  fyn_00 = fy_node_mapping_lookup_by_string(pfVar2,path,sVar11);
                  pcVar12 = acStack_78;
                  flags = local_38;
                  uVar8 = local_34;
                  if (fyn_00 != (fy_node *)0x0) break;
                  fyn_00 = (fy_node *)0x0;
                }
                fyn_01 = (fy_token *)(fyn_01->node).next;
                pcVar12 = acStack_78;
                flags = local_38;
                uVar8 = local_34;
                if ((fyn_01 == (fy_token *)paVar15) ||
                   (pcVar12 = acStack_78, fyn_01 == (fy_token *)0x0)) break;
              } while( true );
            }
          }
          else if (((fyn_00->field_0x34 & 3) == 0) && (fyn_00->style == FYNS_ALIAS)) {
            pfVar2 = fy_node_follow_aliases(fyn_00,flags,false);
            fyn_00 = fy_node_mapping_lookup_by_string(pfVar2,path,sVar11);
            pcVar12 = acStack_78;
          }
          else {
            fyn_00 = (fy_node *)0x0;
            pcVar12 = acStack_78;
          }
        }
      }
      path = pcVar19;
      sVar11 = (long)local_40 - (long)path;
      uVar18 = (ulong)uVar8;
      if ((local_40 != path & (byte)uVar8) == 1) {
        *(undefined8 *)(pcVar12 + -8) = 0x121835;
        fyn_00 = fy_node_follow_aliases(fyn_00,flags,true);
      }
      *(undefined8 *)(pcVar12 + -8) = 0x121846;
      fyn = fy_node_by_path_internal(fyn_00,path,sVar11,flags);
      pcVar14 = local_40;
      goto LAB_0012184d;
    case 3:
      __assert_fail("fy_node_is_mapping(fyn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                    ,0xe9f,
                    "struct fy_node *fy_node_by_path_internal(struct fy_node *, const char *, size_t, enum fy_node_walk_flags)"
                   );
    }
  }
  uVar18 = (ulong)local_34;
  pcVar12 = acStack_78;
LAB_0012184d:
  if ((pcVar14 != path & (byte)uVar18) == 1) {
    *(undefined8 *)(pcVar12 + -8) = 0x12186a;
    pfVar2 = fy_node_follow_aliases(fyn,flags,true);
    return pfVar2;
  }
  return fyn;
}

Assistant:

static struct fy_node *
fy_node_by_path_internal(struct fy_node *fyn,
                         const char *path, size_t pathlen,
                         enum fy_node_walk_flags flags) {
    enum fy_node_walk_flags ptr_flags;
    struct fy_node *fynt, *fyni;
    const char *s, *e, *ss, *ee;
    char *end_idx, *json_key, *t, *p, *uri_path;
    char c;
    int idx, rlen;
    size_t len, json_key_len, uri_path_len;
    bool has_json_key_esc;
    uint8_t code[4];
    int code_length;
    bool trailing_slash;

    if (!fyn || !path)
        return NULL;

    ptr_flags = flags & FYNWF_PTR(FYNWF_PTR_MASK);

    s = path;
    if (pathlen == (size_t) -1)
        pathlen = strlen(path);
    e = s + pathlen;

    /* a trailing slash works just like unix and symbolic links
	 * if it does not exist no symbolic link lookups are performed
	 * at the end of the operation.
	 * if it exists they are followed upon resolution
	 */
    trailing_slash = pathlen > 0 && path[pathlen - 1] == '/';

    /* and continue on path lookup with the rest */

    /* skip all prefixed / */
    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:
            while (s < e && *s == '/')
                s++;
            /* for a last component / always match this one */
            if (s >= e)
                goto out;
            break;

        case FYNWF_PTR_JSON:
            /* "" -> everything here */
            if (s == e)
                return fyn;
            /* it must have a separator here */
            if (*s != '/')
                return NULL;
            s++;
            break;

        case FYNWF_PTR_RELJSON:
            break;
    }

    /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
			__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
    fyn = fy_node_follow_aliases(fyn, flags, true);

    /* scalar can't match (it has no key) */
    if (fy_node_is_scalar(fyn)) {
        fyn = NULL;
        goto out;
    }

    /* for a sequence the only allowed key is [n] where n is the index to follow */
    if (fy_node_is_sequence(fyn)) {

        c = -1;
        switch (ptr_flags) {
            default:
            case FYNWF_PTR_YAML:
                while (s < e && isspace(*s))
                    s++;

                c = *s;
                if (c == '[')
                    s++;
                else if (!isdigit(c) && c != '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                s = end_idx;

                while (s < e && isspace(*s))
                    s++;

                if (c == '[' && *s++ != ']')
                    return NULL;

                while (s < e && isspace(*s))
                    s++;

                break;

            case FYNWF_PTR_JSON:
            case FYNWF_PTR_RELJSON:

                /* special array end - always fails */
                if (*s == '-')
                    return NULL;

                idx = (int) strtol(s, &end_idx, 10);

                /* no digits found at all */
                if (idx == 0 && end_idx == s)
                    return NULL;

                /* no negatives */
                if (idx < 0)
                    return NULL;

                s = end_idx;

                if (s < e && *s == '/')
                    s++;

                break;
        }

        len = e - s;

        fyn = fy_node_sequence_get_by_index(fyn, idx);
        if (trailing_slash)
            fyn = fy_node_follow_aliases(fyn, flags, false);
        fyn = fy_node_by_path_internal(fyn, s, len, flags);
        goto out;
    }

    /* be a little bit paranoid */
    assert(fy_node_is_mapping(fyn));

    path = s;
    pathlen = (size_t) (e - s);

    switch (ptr_flags) {
        default:
        case FYNWF_PTR_YAML:

            /* scan ahead for the end of the path component
		* note that we don't do UTF8 here, because all the
		* escapes are regular ascii characters, i.e.
		* '/', '*', '&', '.', '{', '}', '[', ']' and '\\'
		*/

            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;

                if (c == '\\') {
                    /* it must be a valid escape */
                    if (s >= e || !strchr("/*&.{}[]\\", *s))
                        return NULL;
                    s++;
                } else if (c == '"') {
                    while (s < e && *s != '"') {
                        c = *s++;
                        if (c == '\\' && (s < e && *s == '"'))
                            s++;
                    }
                    /* not a normal double quote end */
                    if (s >= e || *s != '"')
                        return NULL;
                    s++;
                } else if (c == '\'') {
                    while (s < e && *s != '\'') {
                        c = *s++;
                        if (c == '\'' && (s < e && *s == '\''))
                            s++;
                    }
                    /* not a normal single quote end */
                    if (s >= e || *s != '\'')
                        return NULL;
                    s++;
                }
            }
            len = s - path;

            fynt = fyn;
            fyn = fy_node_mapping_lookup_by_string(fyn, path, len);

            /* failed! last ditch attempt, is there a merge key? */
            if (!fyn && fynt && (flags & FYNWF_FOLLOW) && ptr_flags == FYNWF_PTR_YAML) {
                fyn = fy_node_mapping_lookup_by_string(fynt, "<<", 2);
                if (!fyn)
                    goto out;

                if (fy_node_is_alias(fyn)) {

                    /* single alias '<<: *foo' */
                    fyn = fy_node_mapping_lookup_by_string(
                            fy_node_follow_aliases(fyn, flags, false), path, len);

                } else if (fy_node_is_sequence(fyn)) {

                    /* multi aliases '<<: [ *foo, *bar ]' */
                    fynt = fyn;
                    for (fyni = fy_node_list_head(&fynt->sequence); fyni;
                         fyni = fy_node_next(&fynt->sequence, fyni)) {
                        if (!fy_node_is_alias(fyni))
                            continue;
                        fyn = fy_node_mapping_lookup_by_string(
                                fy_node_follow_aliases(fyni, flags, false),
                                path, len);
                        if (fyn)
                            break;
                    }
                } else
                    fyn = NULL;
            }
            break;

        case FYNWF_PTR_JSON:
        case FYNWF_PTR_RELJSON:

            has_json_key_esc = false;
            while (s < e) {
                c = *s;
                /* end of path component? */
                if (c == '/')
                    break;
                s++;
                if (c == '~')
                    has_json_key_esc = true;
            }
            len = s - path;

            if (has_json_key_esc) {
                /* note that the escapes reduce the length, so allocating the
			 * same size is guaranteed safe */
                json_key = alloca(len + 1);

                ss = path;
                ee = s;
                t = json_key;
                while (ss < ee) {
                    if (*ss != '~') {
                        *t++ = *ss++;
                        continue;
                    }
                    /* unterminated ~ escape, or neither ~0, ~1 */
                    if (ss + 1 >= ee || (ss[1] < '0' && ss[1] > '1'))
                        return NULL;
                    *t++ = ss[1] == '0' ? '~' : '/';
                    ss += 2;
                }
                json_key_len = t - json_key;

                path = json_key;
                len = json_key_len;
            }

            /* URI encoded escaped */
            if ((flags & FYNWF_URI_ENCODED) && memchr(path, '%', len)) {
                /* escapes shrink, so safe to allocate as much */
                uri_path = alloca(len + 1);

                ss = path;
                ee = path + len;
                t = uri_path;
                while (ss < ee) {
                    /* copy run until '%' or end */
                    p = memchr(ss, '%', ee - ss);
                    rlen = (p ? p : ee) - ss;
                    memcpy(t, ss, rlen);
                    ss += rlen;
                    t += rlen;

                    /* if end, break */
                    if (!p)
                        break;

                    /* collect a utf8 character sequence */
                    code_length = sizeof(code);
                    ss = fy_uri_esc(ss, ee - ss, code, &code_length);
                    if (!ss) {
                        /* bad % escape sequence */
                        return NULL;
                    }
                    memcpy(t, code, code_length);
                    t += code_length;
                }
                uri_path_len = t - uri_path;

                path = uri_path;
                len = uri_path_len;
            }

            fynt = fyn;
            fyn = fy_node_mapping_lookup_value_by_simple_key(fyn, path, len);
            break;
    }

    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    fyn = fy_node_by_path_internal(fyn, s, len, flags);

    out:
    len = e - s;

    if (len > 0 && trailing_slash) {
        /* fyd_notice(fyn->fyd, "%s:%d following alias @%s \"%.*s\"",
				__func__, __LINE__, fy_node_get_path(fyn), (int)(e - s), s); */
        fyn = fy_node_follow_aliases(fyn, flags, true);
    }

    return fyn;
}